

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void cheat_monster_lore(monster_race *race,monster_lore *lore)

{
  if (race == (monster_race *)0x0) {
    __assert_fail("race",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x16b,
                  "void cheat_monster_lore(const struct monster_race *, struct monster_lore *)");
  }
  if (lore != (monster_lore *)0x0) {
    lore->all_known = true;
    lore_update(race,lore);
    return;
  }
  __assert_fail("lore",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                ,0x16c,"void cheat_monster_lore(const struct monster_race *, struct monster_lore *)"
               );
}

Assistant:

void cheat_monster_lore(const struct monster_race *race, struct monster_lore *lore)
{
	assert(race);
	assert(lore);

	/* Full knowledge */
	lore->all_known = true;
	lore_update(race, lore);
}